

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O3

void __thiscall
CcsTest_InterpolationIsDoneAtLoadTime_Test::TestBody
          (CcsTest_InterpolationIsDoneAtLoadTime_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  char *pcVar3;
  CcsDomain ccs;
  CcsContext ctx;
  istringstream input;
  string local_1e0;
  AssertHelper local_1c0;
  internal local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  CcsDomain local_1a8;
  CcsContext local_1a0;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  ::ccs::CcsDomain::CcsDomain(&local_1a8,false);
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"a = \'foo${VAR1} baz\'","");
  std::__cxx11::istringstream::istringstream(local_190,(string *)&local_1e0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"<literal>","");
  ::ccs::CcsDomain::loadCcsStream
            (&local_1a8,(istream *)local_190,&local_1e0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  ::ccs::CcsDomain::build((CcsDomain *)&local_1a0);
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"a","");
  psVar2 = ::ccs::CcsContext::getString(&local_1a0,&local_1e0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_1b8,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e0);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xa8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1e0._M_dataplus._M_p + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  setenv("VAR1","bar",1);
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"a","");
  psVar2 = ::ccs::CcsContext::getString(&local_1a0,&local_1e0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_1b8,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e0);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1e0._M_dataplus._M_p + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  unsetenv("VAR1");
  if (local_1a0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.searchState.
               super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  ::ccs::CcsDomain::~CcsDomain(&local_1a8);
  return;
}

Assistant:

TEST(CcsTest, InterpolationIsDoneAtLoadTime) {
  CcsDomain ccs;
  std::istringstream input("a = 'foo${VAR1} baz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("foo baz", ctx.getString("a"));
  setenv("VAR1", "bar", true);
  EXPECT_EQ("foo baz", ctx.getString("a"));
  unsetenv("VAR1");
}